

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [32];
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 (*pauVar11) [16];
  int iVar12;
  uint uVar13;
  undefined4 uVar14;
  long lVar15;
  Scene *pSVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong unaff_R15;
  size_t mask;
  vint4 bi_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 bi;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar42;
  float fVar43;
  vint4 ai;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar44;
  undefined1 auVar40 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  uint uVar54;
  uint uVar55;
  uint uVar56;
  undefined1 auVar53 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12f0 [16];
  Scene *local_12e0;
  Geometry *local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  undefined1 (*local_12c0) [16];
  long local_12b8;
  ulong local_12b0;
  ulong local_12a8;
  RTCFilterFunctionNArguments local_12a0;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1210 [16];
  float local_1200 [4];
  float local_11f0 [4];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [32];
  RTCHitN local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar36 [32];
  undefined1 auVar41 [32];
  
  local_12c0 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar37 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar71 = ZEXT1664(CONCAT412(fVar37,CONCAT48(fVar37,CONCAT44(fVar37,fVar37))));
  fVar42 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1110._4_4_ = fVar42;
  local_1110._0_4_ = fVar42;
  local_1110._8_4_ = fVar42;
  local_1110._12_4_ = fVar42;
  auVar49 = ZEXT1664(local_1110);
  fVar37 = fVar37 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar43 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1120._4_4_ = fVar43;
  local_1120._0_4_ = fVar43;
  local_1120._8_4_ = fVar43;
  local_1120._12_4_ = fVar43;
  auVar51 = ZEXT1664(local_1120);
  fVar42 = fVar42 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar43 = fVar43 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_12a8 = uVar20 ^ 0x10;
  local_12b0 = uVar17 ^ 0x10;
  iVar12 = (tray->tfar).field_0.i[k];
  auVar27 = ZEXT1664(CONCAT412(iVar12,CONCAT48(iVar12,CONCAT44(iVar12,iVar12))));
  local_1100._8_4_ = 0x80000000;
  local_1100._0_8_ = 0x8000000080000000;
  local_1100._12_4_ = 0x80000000;
  local_1130._0_8_ = CONCAT44(fVar37,fVar37) ^ 0x8000000080000000;
  local_1130._8_4_ = -fVar37;
  local_1130._12_4_ = -fVar37;
  auVar53 = ZEXT1664(local_1130);
  local_1140._0_8_ = CONCAT44(fVar42,fVar42) ^ 0x8000000080000000;
  local_1140._8_4_ = -fVar42;
  local_1140._12_4_ = -fVar42;
  auVar58 = ZEXT1664(local_1140);
  iVar12 = (tray->tnear).field_0.i[k];
  local_1150._4_4_ = iVar12;
  local_1150._0_4_ = iVar12;
  local_1150._8_4_ = iVar12;
  local_1150._12_4_ = iVar12;
  auVar61 = ZEXT1664(local_1150);
  local_1160._0_8_ = CONCAT44(fVar43,fVar43) ^ 0x8000000080000000;
  local_1160._8_4_ = -fVar43;
  local_1160._12_4_ = -fVar43;
  auVar64 = ZEXT1664(local_1160);
  iVar12 = 1 << ((uint)k & 0x1f);
  auVar26._4_4_ = iVar12;
  auVar26._0_4_ = iVar12;
  auVar26._8_4_ = iVar12;
  auVar26._12_4_ = iVar12;
  auVar26._16_4_ = iVar12;
  auVar26._20_4_ = iVar12;
  auVar26._24_4_ = iVar12;
  auVar26._28_4_ = iVar12;
  auVar36 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar26 = vpand_avx2(auVar26,auVar36);
  local_10e0 = vpcmpeqd_avx2(auVar26,auVar36);
  do {
    do {
      do {
        if (local_12c0 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar11 = local_12c0 + -1;
        local_12c0 = local_12c0 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar11 + 8));
      uVar22 = *(ulong *)*local_12c0;
      do {
        if ((uVar22 & 8) == 0) {
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar19),auVar53._0_16_,
                                    auVar71._0_16_);
          auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar20),auVar58._0_16_,
                                    auVar49._0_16_);
          auVar28 = vpmaxsd_avx(auVar28,auVar33);
          auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + uVar17),auVar64._0_16_,
                                    auVar51._0_16_);
          auVar33 = vpmaxsd_avx(auVar33,auVar61._0_16_);
          auVar33 = vpmaxsd_avx(auVar28,auVar33);
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + (uVar19 ^ 0x10)),
                                    auVar53._0_16_,auVar71._0_16_);
          auVar38 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12a8),
                                    auVar58._0_16_,auVar49._0_16_);
          auVar28 = vpminsd_avx(auVar28,auVar38);
          auVar38 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar22 + 0x20 + local_12b0),
                                    auVar64._0_16_,auVar51._0_16_);
          auVar38 = vpminsd_avx(auVar38,auVar27._0_16_);
          auVar28 = vpminsd_avx(auVar28,auVar38);
          auVar28 = vpcmpgtd_avx(auVar33,auVar28);
          uVar13 = vmovmskps_avx(auVar28);
          unaff_R15 = ((ulong)uVar13 ^ 0xf) & 0xff;
          local_10c0[0] = (RTCHitN)auVar33[0];
          local_10c0[1] = (RTCHitN)auVar33[1];
          local_10c0[2] = (RTCHitN)auVar33[2];
          local_10c0[3] = (RTCHitN)auVar33[3];
          local_10c0[4] = (RTCHitN)auVar33[4];
          local_10c0[5] = (RTCHitN)auVar33[5];
          local_10c0[6] = (RTCHitN)auVar33[6];
          local_10c0[7] = (RTCHitN)auVar33[7];
          local_10c0[8] = (RTCHitN)auVar33[8];
          local_10c0[9] = (RTCHitN)auVar33[9];
          local_10c0[10] = (RTCHitN)auVar33[10];
          local_10c0[0xb] = (RTCHitN)auVar33[0xb];
          local_10c0[0xc] = (RTCHitN)auVar33[0xc];
          local_10c0[0xd] = (RTCHitN)auVar33[0xd];
          local_10c0[0xe] = (RTCHitN)auVar33[0xe];
          local_10c0[0xf] = (RTCHitN)auVar33[0xf];
        }
        if ((uVar22 & 8) == 0) {
          if (unaff_R15 == 0) {
            iVar12 = 4;
          }
          else {
            uVar21 = uVar22 & 0xfffffffffffffff0;
            lVar23 = 0;
            for (uVar22 = unaff_R15; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              lVar23 = lVar23 + 1;
            }
            iVar12 = 0;
            uVar18 = unaff_R15 - 1 & unaff_R15;
            uVar22 = *(ulong *)(uVar21 + lVar23 * 8);
            if (uVar18 != 0) {
              uVar13 = *(uint *)(local_10c0 + lVar23 * 4);
              lVar23 = 0;
              for (uVar9 = uVar18; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000) {
                lVar23 = lVar23 + 1;
              }
              uVar18 = uVar18 - 1 & uVar18;
              uVar9 = *(ulong *)(uVar21 + lVar23 * 8);
              uVar54 = *(uint *)(local_10c0 + lVar23 * 4);
              if (uVar18 == 0) {
                if (uVar13 < uVar54) {
                  *(ulong *)*local_12c0 = uVar9;
                  *(uint *)(*local_12c0 + 8) = uVar54;
                  local_12c0 = local_12c0 + 1;
                }
                else {
                  *(ulong *)*local_12c0 = uVar22;
                  *(uint *)(*local_12c0 + 8) = uVar13;
                  local_12c0 = local_12c0 + 1;
                  uVar22 = uVar9;
                }
              }
              else {
                auVar28._8_8_ = 0;
                auVar28._0_8_ = uVar22;
                auVar28 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar13));
                auVar33._8_8_ = 0;
                auVar33._0_8_ = uVar9;
                auVar33 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar54));
                lVar23 = 0;
                for (uVar22 = uVar18; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000)
                {
                  lVar23 = lVar23 + 1;
                }
                uVar18 = uVar18 - 1 & uVar18;
                auVar38._8_8_ = 0;
                auVar38._0_8_ = *(ulong *)(uVar21 + lVar23 * 8);
                auVar39 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_10c0 + lVar23 * 4)));
                auVar38 = vpcmpgtd_avx(auVar33,auVar28);
                if (uVar18 == 0) {
                  auVar45 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar33,auVar28,auVar45);
                  auVar28 = vblendvps_avx(auVar28,auVar33,auVar45);
                  auVar33 = vpcmpgtd_avx(auVar39,auVar38);
                  auVar45 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar39,auVar38,auVar45);
                  auVar38 = vblendvps_avx(auVar38,auVar39,auVar45);
                  auVar39 = vpcmpgtd_avx(auVar38,auVar28);
                  auVar45 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar38,auVar28,auVar45);
                  auVar28 = vblendvps_avx(auVar28,auVar38,auVar45);
                  *local_12c0 = auVar28;
                  local_12c0[1] = auVar39;
                  uVar22 = auVar33._0_8_;
                  local_12c0 = local_12c0 + 2;
                }
                else {
                  lVar23 = 0;
                  for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                    lVar23 = lVar23 + 1;
                  }
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = *(ulong *)(uVar21 + lVar23 * 8);
                  auVar52 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_10c0 + lVar23 * 4)));
                  auVar45 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar33,auVar28,auVar45);
                  auVar28 = vblendvps_avx(auVar28,auVar33,auVar45);
                  auVar33 = vpcmpgtd_avx(auVar52,auVar39);
                  auVar45 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar52,auVar39,auVar45);
                  auVar39 = vblendvps_avx(auVar39,auVar52,auVar45);
                  auVar45 = vpcmpgtd_avx(auVar39,auVar28);
                  auVar52 = vpshufd_avx(auVar45,0xaa);
                  auVar45 = vblendvps_avx(auVar39,auVar28,auVar52);
                  auVar28 = vblendvps_avx(auVar28,auVar39,auVar52);
                  auVar39 = vpcmpgtd_avx(auVar33,auVar38);
                  auVar52 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar33,auVar38,auVar52);
                  auVar33 = vblendvps_avx(auVar38,auVar33,auVar52);
                  auVar38 = vpcmpgtd_avx(auVar45,auVar33);
                  auVar52 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar45,auVar33,auVar52);
                  auVar33 = vblendvps_avx(auVar33,auVar45,auVar52);
                  *local_12c0 = auVar28;
                  local_12c0[1] = auVar33;
                  local_12c0[2] = auVar38;
                  uVar22 = auVar39._0_8_;
                  local_12c0 = local_12c0 + 3;
                }
              }
            }
          }
        }
        else {
          iVar12 = 6;
        }
      } while (iVar12 == 0);
    } while (iVar12 != 6);
    local_12b8 = (ulong)((uint)uVar22 & 0xf) - 8;
    if (local_12b8 != 0) {
      uVar22 = uVar22 & 0xfffffffffffffff0;
      lVar23 = 0;
      do {
        lVar15 = lVar23 * 0x50;
        pSVar16 = context->scene;
        ppfVar2 = (pSVar16->vertices).items;
        pfVar3 = ppfVar2[*(uint *)(uVar22 + 0x30 + lVar15)];
        pfVar4 = ppfVar2[*(uint *)(uVar22 + 0x34 + lVar15)];
        pfVar5 = ppfVar2[*(uint *)(uVar22 + 0x38 + lVar15)];
        pfVar6 = ppfVar2[*(uint *)(uVar22 + 0x3c + lVar15)];
        auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + lVar15)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 8 + lVar15)));
        auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + lVar15)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 8 + lVar15)));
        auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 4 + lVar15)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0xc + lVar15)));
        auVar33 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 4 + lVar15)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0xc + lVar15)));
        auVar30 = vunpcklps_avx(auVar28,auVar33);
        auVar34 = vunpcklps_avx(auVar38,auVar39);
        auVar47 = vunpckhps_avx(auVar38,auVar39);
        auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + 0x10 + lVar15)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 0x18 + lVar15)));
        auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + 0x10 + lVar15)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 0x18 + lVar15)));
        auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 0x14 + lVar15)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0x1c + lVar15)));
        auVar33 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 0x14 + lVar15)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0x1c + lVar15)));
        auVar52 = vunpcklps_avx(auVar28,auVar33);
        auVar24 = vunpcklps_avx(auVar38,auVar39);
        auVar28 = vunpckhps_avx(auVar38,auVar39);
        auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + 0x20 + lVar15)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 0x28 + lVar15)));
        auVar33 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar3 + *(uint *)(uVar22 + 0x20 + lVar15)),
                                *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar22 + 0x28 + lVar15)));
        auVar45 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 0x24 + lVar15)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0x2c + lVar15)));
        auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar22 + 0x24 + lVar15)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar22 + 0x2c + lVar15)));
        auVar29 = vunpcklps_avx(auVar33,auVar38);
        auVar48 = vunpcklps_avx(auVar39,auVar45);
        auVar45 = vunpckhps_avx(auVar39,auVar45);
        puVar1 = (undefined8 *)(uVar22 + 0x30 + lVar15);
        local_10f0 = *puVar1;
        uStack_10e8 = puVar1[1];
        puVar1 = (undefined8 *)(uVar22 + 0x40 + lVar15);
        local_1270 = *puVar1;
        uStack_1268 = puVar1[1];
        auVar33 = vsubps_avx(auVar34,auVar24);
        auVar28 = vsubps_avx(auVar47,auVar28);
        auVar38 = vsubps_avx(auVar30,auVar52);
        auVar39 = vsubps_avx(auVar48,auVar34);
        auVar45 = vsubps_avx(auVar45,auVar47);
        auVar52 = vsubps_avx(auVar29,auVar30);
        auVar24._0_4_ = auVar52._0_4_ * auVar28._0_4_;
        auVar24._4_4_ = auVar52._4_4_ * auVar28._4_4_;
        auVar24._8_4_ = auVar52._8_4_ * auVar28._8_4_;
        auVar24._12_4_ = auVar52._12_4_ * auVar28._12_4_;
        local_11d0 = vfmsub231ps_fma(auVar24,auVar45,auVar38);
        auVar29._0_4_ = auVar38._0_4_ * auVar39._0_4_;
        auVar29._4_4_ = auVar38._4_4_ * auVar39._4_4_;
        auVar29._8_4_ = auVar38._8_4_ * auVar39._8_4_;
        auVar29._12_4_ = auVar38._12_4_ * auVar39._12_4_;
        local_11c0 = vfmsub231ps_fma(auVar29,auVar52,auVar33);
        uVar14 = *(undefined4 *)(ray + k * 4);
        auVar62._4_4_ = uVar14;
        auVar62._0_4_ = uVar14;
        auVar62._8_4_ = uVar14;
        auVar62._12_4_ = uVar14;
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar65._4_4_ = uVar14;
        auVar65._0_4_ = uVar14;
        auVar65._8_4_ = uVar14;
        auVar65._12_4_ = uVar14;
        uVar14 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar68._4_4_ = uVar14;
        auVar68._0_4_ = uVar14;
        auVar68._8_4_ = uVar14;
        auVar68._12_4_ = uVar14;
        fVar37 = *(float *)(ray + k * 4 + 0x80);
        auVar57._4_4_ = fVar37;
        auVar57._0_4_ = fVar37;
        auVar57._8_4_ = fVar37;
        auVar57._12_4_ = fVar37;
        auVar34 = vsubps_avx(auVar34,auVar62);
        fVar42 = *(float *)(ray + k * 4 + 0xa0);
        auVar63._4_4_ = fVar42;
        auVar63._0_4_ = fVar42;
        auVar63._8_4_ = fVar42;
        auVar63._12_4_ = fVar42;
        auVar47 = vsubps_avx(auVar47,auVar65);
        fVar43 = *(float *)(ray + k * 4 + 0xc0);
        auVar66._4_4_ = fVar43;
        auVar66._0_4_ = fVar43;
        auVar66._8_4_ = fVar43;
        auVar66._12_4_ = fVar43;
        auVar30 = vsubps_avx(auVar30,auVar68);
        auVar69._0_4_ = fVar37 * auVar47._0_4_;
        auVar69._4_4_ = fVar37 * auVar47._4_4_;
        auVar69._8_4_ = fVar37 * auVar47._8_4_;
        auVar69._12_4_ = fVar37 * auVar47._12_4_;
        auVar24 = vfmsub231ps_fma(auVar69,auVar34,auVar63);
        auVar59._0_4_ = auVar52._0_4_ * auVar24._0_4_;
        auVar59._4_4_ = auVar52._4_4_ * auVar24._4_4_;
        auVar59._8_4_ = auVar52._8_4_ * auVar24._8_4_;
        auVar59._12_4_ = auVar52._12_4_ * auVar24._12_4_;
        auVar70._0_4_ = auVar38._0_4_ * auVar24._0_4_;
        auVar70._4_4_ = auVar38._4_4_ * auVar24._4_4_;
        auVar70._8_4_ = auVar38._8_4_ * auVar24._8_4_;
        auVar70._12_4_ = auVar38._12_4_ * auVar24._12_4_;
        auVar52._0_4_ = fVar43 * auVar34._0_4_;
        auVar52._4_4_ = fVar43 * auVar34._4_4_;
        auVar52._8_4_ = fVar43 * auVar34._8_4_;
        auVar52._12_4_ = fVar43 * auVar34._12_4_;
        auVar52 = vfmsub231ps_fma(auVar52,auVar30,auVar57);
        auVar38 = vfmadd231ps_fma(auVar59,auVar52,auVar45);
        auVar52 = vfmadd231ps_fma(auVar70,auVar28,auVar52);
        auVar50._0_4_ = auVar45._0_4_ * auVar33._0_4_;
        auVar50._4_4_ = auVar45._4_4_ * auVar33._4_4_;
        auVar50._8_4_ = auVar45._8_4_ * auVar33._8_4_;
        auVar50._12_4_ = auVar45._12_4_ * auVar33._12_4_;
        local_11b0 = vfmsub231ps_fma(auVar50,auVar39,auVar28);
        auVar48._0_4_ = fVar42 * auVar30._0_4_;
        auVar48._4_4_ = fVar42 * auVar30._4_4_;
        auVar48._8_4_ = fVar42 * auVar30._8_4_;
        auVar48._12_4_ = fVar42 * auVar30._12_4_;
        auVar24 = vfmsub231ps_fma(auVar48,auVar47,auVar66);
        auVar67._0_4_ = local_11b0._0_4_ * fVar43;
        auVar67._4_4_ = local_11b0._4_4_ * fVar43;
        auVar67._8_4_ = local_11b0._8_4_ * fVar43;
        auVar67._12_4_ = local_11b0._12_4_ * fVar43;
        auVar28 = vfmadd231ps_fma(auVar67,local_11c0,auVar63);
        auVar45 = vfmadd231ps_fma(auVar28,local_11d0,auVar57);
        auVar38 = vfmadd231ps_fma(auVar38,auVar24,auVar39);
        auVar28 = vandps_avx(auVar45,local_1100);
        uVar13 = auVar28._0_4_;
        local_1260._0_4_ = (float)(uVar13 ^ auVar38._0_4_);
        uVar54 = auVar28._4_4_;
        local_1260._4_4_ = (float)(uVar54 ^ auVar38._4_4_);
        uVar55 = auVar28._8_4_;
        local_1260._8_4_ = (float)(uVar55 ^ auVar38._8_4_);
        uVar56 = auVar28._12_4_;
        local_1260._12_4_ = (float)(uVar56 ^ auVar38._12_4_);
        auVar28 = vfmadd231ps_fma(auVar52,auVar33,auVar24);
        local_1250._0_4_ = (float)(uVar13 ^ auVar28._0_4_);
        local_1250._4_4_ = (float)(uVar54 ^ auVar28._4_4_);
        local_1250._8_4_ = (float)(uVar55 ^ auVar28._8_4_);
        local_1250._12_4_ = (float)(uVar56 ^ auVar28._12_4_);
        auVar38 = ZEXT816(0) << 0x20;
        auVar28 = vcmpps_avx(local_1260,auVar38,5);
        auVar33 = vcmpps_avx(local_1250,auVar38,5);
        auVar28 = vandps_avx(auVar33,auVar28);
        auVar39._8_4_ = 0x7fffffff;
        auVar39._0_8_ = 0x7fffffff7fffffff;
        auVar39._12_4_ = 0x7fffffff;
        local_1230 = vandps_avx(auVar45,auVar39);
        auVar33 = vcmpps_avx(auVar45,auVar38,4);
        auVar28 = vandps_avx(auVar28,auVar33);
        auVar60._0_4_ = local_1260._0_4_ + local_1250._0_4_;
        auVar60._4_4_ = local_1260._4_4_ + local_1250._4_4_;
        auVar60._8_4_ = local_1260._8_4_ + local_1250._8_4_;
        auVar60._12_4_ = local_1260._12_4_ + local_1250._12_4_;
        auVar33 = vcmpps_avx(auVar60,local_1230,2);
        auVar38 = auVar33 & auVar28;
        if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar38[0xf] < '\0') {
          auVar28 = vandps_avx(auVar28,auVar33);
          auVar46._0_4_ = local_11b0._0_4_ * auVar30._0_4_;
          auVar46._4_4_ = local_11b0._4_4_ * auVar30._4_4_;
          auVar46._8_4_ = local_11b0._8_4_ * auVar30._8_4_;
          auVar46._12_4_ = local_11b0._12_4_ * auVar30._12_4_;
          auVar33 = vfmadd213ps_fma(auVar47,local_11c0,auVar46);
          auVar33 = vfmadd213ps_fma(auVar34,local_11d0,auVar33);
          local_1240._0_4_ = (float)(uVar13 ^ auVar33._0_4_);
          local_1240._4_4_ = (float)(uVar54 ^ auVar33._4_4_);
          local_1240._8_4_ = (float)(uVar55 ^ auVar33._8_4_);
          local_1240._12_4_ = (float)(uVar56 ^ auVar33._12_4_);
          fVar37 = *(float *)(ray + k * 4 + 0x60);
          auVar34._0_4_ = local_1230._0_4_ * fVar37;
          auVar34._4_4_ = local_1230._4_4_ * fVar37;
          auVar34._8_4_ = local_1230._8_4_ * fVar37;
          auVar34._12_4_ = local_1230._12_4_ * fVar37;
          auVar33 = vcmpps_avx(auVar34,local_1240,1);
          fVar37 = *(float *)(ray + k * 4 + 0x100);
          auVar47._0_4_ = local_1230._0_4_ * fVar37;
          auVar47._4_4_ = local_1230._4_4_ * fVar37;
          auVar47._8_4_ = local_1230._8_4_ * fVar37;
          auVar47._12_4_ = local_1230._12_4_ * fVar37;
          auVar38 = vcmpps_avx(local_1240,auVar47,2);
          auVar33 = vandps_avx(auVar33,auVar38);
          auVar38 = auVar28 & auVar33;
          if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar38[0xf] < '\0') {
            local_12f0 = vandps_avx(auVar28,auVar33);
            local_1210 = local_12f0;
            auVar28 = vrcpps_avx(local_1230);
            auVar30._8_4_ = 0x3f800000;
            auVar30._0_8_ = &DAT_3f8000003f800000;
            auVar30._12_4_ = 0x3f800000;
            auVar33 = vfnmadd213ps_fma(local_1230,auVar28,auVar30);
            auVar28 = vfmadd132ps_fma(auVar33,auVar28,auVar28);
            fVar37 = auVar28._0_4_;
            local_11e0._0_4_ = fVar37 * local_1240._0_4_;
            fVar42 = auVar28._4_4_;
            local_11e0._4_4_ = fVar42 * local_1240._4_4_;
            fVar43 = auVar28._8_4_;
            local_11e0._8_4_ = fVar43 * local_1240._8_4_;
            fVar44 = auVar28._12_4_;
            local_11e0._12_4_ = fVar44 * local_1240._12_4_;
            auVar27 = ZEXT1664(local_11e0);
            local_1200[0] = fVar37 * local_1260._0_4_;
            local_1200[1] = fVar42 * local_1260._4_4_;
            local_1200[2] = fVar43 * local_1260._8_4_;
            local_1200[3] = fVar44 * local_1260._12_4_;
            auVar31._8_4_ = 0x7f800000;
            auVar31._0_8_ = 0x7f8000007f800000;
            auVar31._12_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar31,local_11e0,local_12f0);
            local_11f0[0] = fVar37 * local_1250._0_4_;
            local_11f0[1] = fVar42 * local_1250._4_4_;
            local_11f0[2] = fVar43 * local_1250._8_4_;
            local_11f0[3] = fVar44 * local_1250._12_4_;
            auVar33 = vshufps_avx(auVar28,auVar28,0xb1);
            auVar33 = vminps_avx(auVar33,auVar28);
            auVar38 = vshufpd_avx(auVar33,auVar33,1);
            auVar33 = vminps_avx(auVar38,auVar33);
            auVar33 = vcmpps_avx(auVar28,auVar33,0);
            auVar38 = local_12f0 & auVar33;
            auVar28 = vpcmpeqd_avx(auVar28,auVar28);
            if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar38[0xf] < '\0') {
              auVar28 = auVar33;
            }
            auVar28 = vandps_avx(local_12f0,auVar28);
            uVar14 = vmovmskps_avx(auVar28);
            local_12d0 = 0;
            for (uVar21 = CONCAT44((int)((ulong)lVar15 >> 0x20),uVar14); local_12e0 = pSVar16,
                (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              local_12d0 = local_12d0 + 1;
            }
            do {
              uVar13 = *(uint *)((long)&local_10f0 + local_12d0 * 4);
              uVar21 = (ulong)uVar13;
              local_12d8 = (pSVar16->geometries).items[uVar21].ptr;
              if ((local_12d8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_12f0 + local_12d0 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_12d8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar37 = local_1200[local_12d0];
                  fVar42 = local_11f0[local_12d0];
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)(local_11e0 + local_12d0 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) =
                       *(undefined4 *)(local_11d0 + local_12d0 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) =
                       *(undefined4 *)(local_11c0 + local_12d0 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) =
                       *(undefined4 *)(local_11b0 + local_12d0 * 4);
                  *(float *)(ray + k * 4 + 0x1e0) = fVar37;
                  *(float *)(ray + k * 4 + 0x200) = fVar42;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)((long)&local_1270 + local_12d0 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar13;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                local_1180 = auVar27._0_16_;
                local_1170 = auVar71._0_16_;
                fVar37 = local_1200[local_12d0];
                local_1060._4_4_ = fVar37;
                local_1060._0_4_ = fVar37;
                local_1060._8_4_ = fVar37;
                local_1060._12_4_ = fVar37;
                local_1060._16_4_ = fVar37;
                local_1060._20_4_ = fVar37;
                local_1060._24_4_ = fVar37;
                local_1060._28_4_ = fVar37;
                local_1040 = local_11f0[local_12d0];
                uVar14 = *(undefined4 *)((long)&local_1270 + local_12d0 * 4);
                auVar40._4_4_ = uVar14;
                auVar40._0_4_ = uVar14;
                auVar40._8_4_ = uVar14;
                auVar40._12_4_ = uVar14;
                auVar41._16_4_ = uVar14;
                auVar41._0_16_ = auVar40;
                auVar41._20_4_ = uVar14;
                auVar41._24_4_ = uVar14;
                auVar41._28_4_ = uVar14;
                local_10c0._4_4_ = *(undefined4 *)(local_11d0 + local_12d0 * 4);
                uVar14 = *(undefined4 *)(local_11c0 + local_12d0 * 4);
                local_10a0._4_4_ = uVar14;
                local_10a0._0_4_ = uVar14;
                local_10a0._8_4_ = uVar14;
                local_10a0._12_4_ = uVar14;
                local_10a0._16_4_ = uVar14;
                local_10a0._20_4_ = uVar14;
                local_10a0._24_4_ = uVar14;
                local_10a0._28_4_ = uVar14;
                uVar14 = *(undefined4 *)(local_11b0 + local_12d0 * 4);
                local_1080._4_4_ = uVar14;
                local_1080._0_4_ = uVar14;
                local_1080._8_4_ = uVar14;
                local_1080._12_4_ = uVar14;
                local_1080._16_4_ = uVar14;
                local_1080._20_4_ = uVar14;
                local_1080._24_4_ = uVar14;
                local_1080._28_4_ = uVar14;
                auVar35._4_4_ = uVar13;
                auVar35._0_4_ = uVar13;
                auVar35._8_4_ = uVar13;
                auVar35._12_4_ = uVar13;
                auVar36._16_4_ = uVar13;
                auVar36._0_16_ = auVar35;
                auVar36._20_4_ = uVar13;
                auVar36._24_4_ = uVar13;
                auVar36._28_4_ = uVar13;
                local_10c0._0_4_ = local_10c0._4_4_;
                local_10c0._8_4_ = local_10c0._4_4_;
                local_10c0._12_4_ = local_10c0._4_4_;
                local_10c0[0x10] = (RTCHitN)(char)local_10c0._4_4_;
                local_10c0[0x11] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
                local_10c0[0x12] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
                local_10c0[0x13] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
                local_10c0[0x14] = (RTCHitN)(char)local_10c0._4_4_;
                local_10c0[0x15] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
                local_10c0[0x16] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
                local_10c0[0x17] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
                local_10c0[0x18] = (RTCHitN)(char)local_10c0._4_4_;
                local_10c0[0x19] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
                local_10c0[0x1a] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
                local_10c0[0x1b] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
                local_10c0[0x1c] = (RTCHitN)(char)local_10c0._4_4_;
                local_10c0[0x1d] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 8);
                local_10c0[0x1e] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x10);
                local_10c0[0x1f] = (RTCHitN)(char)((uint)local_10c0._4_4_ >> 0x18);
                fStack_103c = local_1040;
                fStack_1038 = local_1040;
                fStack_1034 = local_1040;
                fStack_1030 = local_1040;
                fStack_102c = local_1040;
                fStack_1028 = local_1040;
                fStack_1024 = local_1040;
                local_1020 = auVar41;
                local_1000 = auVar36;
                vpcmpeqd_avx2(local_1060,local_1060);
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                uVar14 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_11e0 + local_12d0 * 4);
                local_11a0 = local_10e0._0_8_;
                uStack_1198 = local_10e0._8_8_;
                uStack_1190 = local_10e0._16_8_;
                uStack_1188 = local_10e0._24_8_;
                local_12a0.valid = (int *)&local_11a0;
                local_12a0.geometryUserPtr = local_12d8->userPtr;
                local_12a0.context = context->user;
                local_12a0.hit = local_10c0;
                local_12a0.N = 8;
                local_12c8 = uVar20;
                local_12a0.ray = (RTCRayN *)ray;
                if (local_12d8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar36 = ZEXT1632(auVar35);
                  auVar41 = ZEXT1632(auVar40);
                  (*local_12d8->intersectionFilterN)(&local_12a0);
                }
                auVar8._8_8_ = uStack_1198;
                auVar8._0_8_ = local_11a0;
                auVar8._16_8_ = uStack_1190;
                auVar8._24_8_ = uStack_1188;
                auVar8 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar8);
                auVar26 = _DAT_0205a980 & ~auVar8;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar26 >> 0x7f,0) == '\0') &&
                      (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0xbf,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar26[0x1f]) {
                  auVar27 = ZEXT3264(auVar8 ^ _DAT_0205a980);
                }
                else {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_12d8->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar36 = ZEXT1632(auVar36._0_16_);
                    auVar41 = ZEXT1632(auVar41._0_16_);
                    (*p_Var7)(&local_12a0);
                  }
                  auVar10._8_8_ = uStack_1198;
                  auVar10._0_8_ = local_11a0;
                  auVar10._16_8_ = uStack_1190;
                  auVar10._24_8_ = uStack_1188;
                  auVar8 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar10);
                  auVar26 = vpcmpeqd_avx2(auVar41,auVar41);
                  auVar27 = ZEXT3264(auVar8 ^ auVar26);
                  auVar36 = vpcmpeqd_avx2(auVar36,auVar36);
                  auVar26 = auVar26 & ~auVar8;
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    auVar8 = auVar8 ^ auVar36;
                    auVar26 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])local_12a0.hit);
                    *(undefined1 (*) [32])(local_12a0.ray + 0x180) = auVar26;
                    auVar26 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x20));
                    *(undefined1 (*) [32])(local_12a0.ray + 0x1a0) = auVar26;
                    auVar26 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x40));
                    *(undefined1 (*) [32])(local_12a0.ray + 0x1c0) = auVar26;
                    auVar26 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x60));
                    *(undefined1 (*) [32])(local_12a0.ray + 0x1e0) = auVar26;
                    auVar26 = vmaskmovps_avx(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x80));
                    *(undefined1 (*) [32])(local_12a0.ray + 0x200) = auVar26;
                    auVar26 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0xa0));
                    *(undefined1 (*) [32])(local_12a0.ray + 0x220) = auVar26;
                    auVar26 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0xc0));
                    *(undefined1 (*) [32])(local_12a0.ray + 0x240) = auVar26;
                    auVar26 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0xe0));
                    *(undefined1 (*) [32])(local_12a0.ray + 0x260) = auVar26;
                    auVar26 = vpmaskmovd_avx2(auVar8,*(undefined1 (*) [32])(local_12a0.hit + 0x100))
                    ;
                    *(undefined1 (*) [32])(local_12a0.ray + 0x280) = auVar26;
                  }
                }
                auVar26 = auVar27._0_32_;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar26 >> 0x7f,0) == '\0') &&
                      (auVar27 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                     SUB321(auVar26 >> 0xbf,0) == '\0') &&
                    (auVar27 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                    -1 < auVar27[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar14;
                }
                *(undefined4 *)(local_12f0 + local_12d0 * 4) = 0;
                uVar14 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar25._4_4_ = uVar14;
                auVar25._0_4_ = uVar14;
                auVar25._8_4_ = uVar14;
                auVar25._12_4_ = uVar14;
                auVar27 = ZEXT1664(local_1180);
                auVar28 = vcmpps_avx(local_1180,auVar25,2);
                local_12f0 = vandps_avx(auVar28,local_12f0);
                auVar71 = ZEXT1664(local_1170);
                uVar21 = local_12d0;
                pSVar16 = local_12e0;
                uVar20 = local_12c8;
              }
              if ((((local_12f0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_12f0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_12f0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_12f0[0xf]) break;
              auVar32._8_4_ = 0x7f800000;
              auVar32._0_8_ = 0x7f8000007f800000;
              auVar32._12_4_ = 0x7f800000;
              auVar28 = vblendvps_avx(auVar32,auVar27._0_16_,local_12f0);
              auVar33 = vshufps_avx(auVar28,auVar28,0xb1);
              auVar33 = vminps_avx(auVar33,auVar28);
              auVar38 = vshufpd_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar38,auVar33);
              auVar33 = vcmpps_avx(auVar28,auVar33,0);
              auVar38 = local_12f0 & auVar33;
              auVar28 = local_12f0;
              if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar38[0xf] < '\0') {
                auVar28 = vandps_avx(auVar33,local_12f0);
              }
              uVar14 = vmovmskps_avx(auVar28);
              local_12d0 = 0;
              for (uVar21 = CONCAT44((int)(uVar21 >> 0x20),uVar14); (uVar21 & 1) == 0;
                  uVar21 = uVar21 >> 1 | 0x8000000000000000) {
                local_12d0 = local_12d0 + 1;
              }
            } while( true );
          }
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != local_12b8);
    }
    uVar14 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar27 = ZEXT1664(CONCAT412(uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))));
    auVar49 = ZEXT1664(local_1110);
    auVar51 = ZEXT1664(local_1120);
    auVar53 = ZEXT1664(local_1130);
    auVar58 = ZEXT1664(local_1140);
    auVar61 = ZEXT1664(local_1150);
    auVar64 = ZEXT1664(local_1160);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }